

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O1

void __thiscall Diligent::SPIRVShaderResources::~SPIRVShaderResources(SPIRVShaderResources *this)

{
  void *pvVar1;
  Uint32 UVar2;
  Uint32 UVar3;
  Uint32 UVar4;
  
  UVar2 = (Uint32)this->m_StorageBufferOffset;
  if (this->m_StorageBufferOffset != 0) {
    UVar3 = 0;
    do {
      GetResAttribs(this,UVar3,UVar2,0);
      UVar3 = UVar3 + 1;
      UVar2 = (Uint32)this->m_StorageBufferOffset;
    } while (UVar3 < UVar2);
  }
  UVar2 = (Uint32)this->m_StorageBufferOffset;
  UVar3 = (uint)this->m_StorageImageOffset - (uint)this->m_StorageBufferOffset;
  if (UVar3 != 0) {
    UVar4 = 0;
    do {
      GetResAttribs(this,UVar4,UVar3,UVar2);
      UVar4 = UVar4 + 1;
      UVar2 = (Uint32)this->m_StorageBufferOffset;
      UVar3 = this->m_StorageImageOffset - UVar2;
    } while (UVar4 < UVar3);
  }
  UVar2 = (Uint32)this->m_StorageImageOffset;
  UVar3 = (uint)this->m_SampledImageOffset - (uint)this->m_StorageImageOffset;
  if (UVar3 != 0) {
    UVar4 = 0;
    do {
      GetResAttribs(this,UVar4,UVar3,UVar2);
      UVar4 = UVar4 + 1;
      UVar2 = (Uint32)this->m_StorageImageOffset;
      UVar3 = this->m_SampledImageOffset - UVar2;
    } while (UVar4 < UVar3);
  }
  UVar2 = (Uint32)this->m_SampledImageOffset;
  UVar3 = (uint)this->m_AtomicCounterOffset - (uint)this->m_SampledImageOffset;
  if (UVar3 != 0) {
    UVar4 = 0;
    do {
      GetResAttribs(this,UVar4,UVar3,UVar2);
      UVar4 = UVar4 + 1;
      UVar2 = (Uint32)this->m_SampledImageOffset;
      UVar3 = this->m_AtomicCounterOffset - UVar2;
    } while (UVar4 < UVar3);
  }
  UVar2 = (Uint32)this->m_AtomicCounterOffset;
  UVar3 = (uint)this->m_SeparateSamplerOffset - (uint)this->m_AtomicCounterOffset;
  if (UVar3 != 0) {
    UVar4 = 0;
    do {
      GetResAttribs(this,UVar4,UVar3,UVar2);
      UVar4 = UVar4 + 1;
      UVar2 = (Uint32)this->m_AtomicCounterOffset;
      UVar3 = this->m_SeparateSamplerOffset - UVar2;
    } while (UVar4 < UVar3);
  }
  UVar2 = (Uint32)this->m_SeparateSamplerOffset;
  UVar3 = (uint)this->m_SeparateImageOffset - (uint)this->m_SeparateSamplerOffset;
  if (UVar3 != 0) {
    UVar4 = 0;
    do {
      GetResAttribs(this,UVar4,UVar3,UVar2);
      UVar4 = UVar4 + 1;
      UVar2 = (Uint32)this->m_SeparateSamplerOffset;
      UVar3 = this->m_SeparateImageOffset - UVar2;
    } while (UVar4 < UVar3);
  }
  UVar2 = (Uint32)this->m_SeparateImageOffset;
  UVar3 = (uint)this->m_InputAttachmentOffset - (uint)this->m_SeparateImageOffset;
  if (UVar3 != 0) {
    UVar4 = 0;
    do {
      GetResAttribs(this,UVar4,UVar3,UVar2);
      UVar4 = UVar4 + 1;
      UVar2 = (Uint32)this->m_SeparateImageOffset;
      UVar3 = this->m_InputAttachmentOffset - UVar2;
    } while (UVar4 < UVar3);
  }
  UVar2 = (Uint32)this->m_InputAttachmentOffset;
  UVar3 = (uint)this->m_AccelStructOffset - (uint)this->m_InputAttachmentOffset;
  if (UVar3 != 0) {
    UVar4 = 0;
    do {
      GetResAttribs(this,UVar4,UVar3,UVar2);
      UVar4 = UVar4 + 1;
      UVar2 = (Uint32)this->m_InputAttachmentOffset;
      UVar3 = this->m_AccelStructOffset - UVar2;
    } while (UVar4 < UVar3);
  }
  if (this->m_NumShaderStageInputs != 0) {
    UVar2 = 0;
    do {
      GetShaderStageInputAttribs(this,UVar2);
      UVar2 = UVar2 + 1;
    } while (UVar2 < this->m_NumShaderStageInputs);
  }
  UVar2 = (Uint32)this->m_AccelStructOffset;
  UVar3 = (uint)this->m_TotalResources - (uint)this->m_AccelStructOffset;
  if (UVar3 != 0) {
    UVar4 = 0;
    do {
      GetResAttribs(this,UVar4,UVar3,UVar2);
      UVar4 = UVar4 + 1;
      UVar2 = (Uint32)this->m_AccelStructOffset;
      UVar3 = this->m_TotalResources - UVar2;
    } while (UVar4 < UVar3);
  }
  pvVar1 = (this->m_UBReflectionBuffer)._M_t.
           super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t
           .super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
           super__Head_base<0UL,_void_*,_false>._M_head_impl;
  if (pvVar1 != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)&this->m_UBReflectionBuffer,pvVar1);
  }
  (this->m_UBReflectionBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  pvVar1 = (this->m_MemoryBuffer)._M_t.
           super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t
           .super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
           super__Head_base<0UL,_void_*,_false>._M_head_impl;
  if (pvVar1 != (void *)0x0) {
    STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
              ((STDDeleter<void,_Diligent::IMemoryAllocator> *)this,pvVar1);
  }
  (this->m_MemoryBuffer)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  return;
}

Assistant:

SPIRVShaderResources::~SPIRVShaderResources()
{
    for (Uint32 n = 0; n < GetNumUBs(); ++n)
        GetUB(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSBs(); ++n)
        GetSB(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumImgs(); ++n)
        GetImg(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSmpldImgs(); ++n)
        GetSmpldImg(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumACs(); ++n)
        GetAC(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSepSmplrs(); ++n)
        GetSepSmplr(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumSepImgs(); ++n)
        GetSepImg(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumInptAtts(); ++n)
        GetInptAtt(n).~SPIRVShaderResourceAttribs();

    for (Uint32 n = 0; n < GetNumShaderStageInputs(); ++n)
        GetShaderStageInputAttribs(n).~SPIRVShaderStageInputAttribs();

    for (Uint32 n = 0; n < GetNumAccelStructs(); ++n)
        GetAccelStruct(n).~SPIRVShaderResourceAttribs();

    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please add destructor for the new resource");
}